

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_Symbol_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  JSRefCountHeader *p;
  BOOL unicode;
  int iVar13;
  BOOL BVar14;
  JSRegExp *pJVar17;
  JSValueUnion *pJVar18;
  ulong uVar19;
  uint uVar15;
  uint uVar16;
  uint8_t **capture;
  sbyte sVar20;
  int64_t iVar21;
  uint32_t uVar22;
  int64_t extraout_RDX;
  JSString *cbuf;
  JSContext *pJVar23;
  long lVar24;
  JSString *bc_buf;
  JSValueUnion JVar25;
  JSValueUnion JVar26;
  uint32_t to;
  JSValueUnion JVar27;
  ulong uVar28;
  ulong uVar29;
  JSValueUnion JVar30;
  bool bVar31;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue val;
  JSValue v_04;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue v_05;
  JSValue obj_02;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue v_06;
  JSValue JVar32;
  JSValue JVar33;
  JSValue JVar34;
  JSValue JVar35;
  JSValue val_00;
  JSValue JVar36;
  JSValue JVar37;
  JSValue JVar38;
  JSValue JVar39;
  JSValue obj_03;
  JSValue val_01;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  int64_t local_1d0;
  JSString *local_1c0;
  JSValueUnion local_1b8;
  JSRefCountHeader *p_1;
  JSValueUnion local_1a8;
  JSValueUnion local_198;
  JSValueUnion local_190;
  uint32_t nCaptures;
  JSValueUnion local_180;
  ulong local_178;
  JSContext *local_170;
  ulong local_168;
  int64_t position;
  int64_t local_158;
  JSValueUnion local_150;
  ulong local_148;
  JSValueUnion local_140;
  uint32_t local_138;
  int local_134;
  long local_130;
  int64_t thisIndex;
  JSString *local_120;
  JSValueUnion local_118;
  int64_t local_110;
  ulong local_108;
  undefined8 local_100;
  JSValueUnion local_f8;
  int64_t local_f0;
  JSValueUnion local_e8;
  int64_t local_e0;
  JSValueUnion local_d8;
  int64_t local_d0;
  JSValueUnion local_c0;
  JSValueUnion local_b8;
  StringBuffer local_b0;
  ValueBuffer v_b;
  
  JVar26 = this_val.u;
  if ((int)this_val.tag != -1) {
    uVar19 = 6;
    JS_ThrowTypeErrorNotAnObject(ctx);
    local_198.float64 = 0.0;
    goto LAB_00135da5;
  }
  pJVar18 = &argv[1].u;
  JVar30 = (JSValueUnion)pJVar18->ptr;
  JVar25 = (JSValueUnion)argv[1].tag;
  JVar37 = *(JSValue *)pJVar18;
  JVar33 = *(JSValue *)pJVar18;
  string_buffer_init(ctx,&local_b0,0);
  v_b.arr = v_b.def;
  v_b.len = 0;
  v_b.size = 4;
  v_b.error_status = 0;
  v_b.ctx = ctx;
  JVar32 = JS_ToString(ctx,*argv);
  val.tag = JVar32.tag;
  local_180 = JVar32.u;
  local_168 = 6;
  if ((uint)JVar32.tag == 6) {
    local_1b8.float64 = 0.0;
    JVar39 = (JSValue)(ZEXT816(6) << 0x40);
    local_198.float64 = 0.0;
    JVar36 = (JSValue)(ZEXT816(3) << 0x40);
    JVar35 = (JSValue)(ZEXT816(3) << 0x40);
    JVar37.tag = 3;
    JVar37.u.ptr = JVar25.ptr;
    val_00 = (JSValue)(ZEXT816(3) << 0x40);
    JVar33 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    local_134 = JS_IsFunction(ctx,JVar33);
    JVar33 = (JSValue)(ZEXT816(3) << 0x40);
    JVar27.float64 = 0.0;
    local_178 = 3;
    if (local_134 == 0) {
      JVar33 = JS_ToString(ctx,JVar37);
      JVar27 = JVar33.u;
      if ((int)JVar33.tag != 6) goto LAB_00135c05;
LAB_00135cb2:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_168;
      JVar39 = (JSValue)(auVar2 << 0x40);
      local_198.float64 = 0.0;
      JVar26 = JVar25;
    }
    else {
LAB_00135c05:
      local_158 = JVar33.tag;
      local_150 = JVar33.u;
      JVar33 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
      iVar12 = JS_ToBoolFree(ctx,JVar33);
      JVar33.tag = local_158;
      JVar33.u.ptr = local_150.ptr;
      if (iVar12 < 0) goto LAB_00135cb2;
      if (iVar12 == 0) {
        unicode = 0;
      }
      else {
        JVar33 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
        unicode = JS_ToBoolFree(ctx,JVar33);
        if (unicode < 0) {
          local_1b8.float64 = 0.0;
          JVar37.tag = 3;
          JVar37.u.ptr = JVar25.ptr;
LAB_001361f9:
          JVar33.tag = local_158;
          JVar33.u.ptr = local_150.ptr;
          JVar32.tag = val.tag;
          JVar32.u.float64 = local_180.float64;
          JVar36 = (JSValue)(ZEXT816(3) << 0x40);
          local_198.float64 = 0.0;
          JVar35 = (JSValue)(ZEXT816(3) << 0x40);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_178;
          val_00 = (JSValue)(auVar9 << 0x40);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_168;
          JVar39 = (JSValue)(auVar3 << 0x40);
          goto LAB_00135cf4;
        }
        iVar13 = JS_SetProperty(ctx,this_val,0x55,(JSValue)ZEXT816(0));
        JVar33.tag = local_158;
        JVar33.u.ptr = local_150.ptr;
        if (iVar13 < 0) goto LAB_00135cb2;
      }
      local_c0 = JVar25;
      local_b8 = JVar30;
      if (((JVar27.ptr == (void *)0x0) || (iVar12 == 0)) ||
         ((*(ulong *)((long)JVar27.ptr + 4) & 0x7fffffff) != 0)) {
LAB_00135f1f:
        local_178 = 3;
        JVar37 = (JSValue)(ZEXT816(3) << 0x40);
        local_170 = ctx;
        do {
          local_1c0 = (JSString *)JVar37.tag;
          JVar26 = JVar37.u;
          JVar36.tag = val.tag;
          JVar36.u.ptr = local_180.ptr;
          JVar33 = JS_RegExpExec(ctx,this_val,JVar36);
          uVar19 = (ulong)JVar26.ptr & 0xffffffff;
          if ((int)JVar33.tag == 2) {
LAB_00136203:
            ctx = local_170;
            JVar39.tag = (int64_t)local_1c0;
            JVar39.u.ptr = (void *)(uVar19 | (long)JVar30.ptr << 0x20);
            lVar24 = 0;
            uVar22 = 0;
            p_1 = (JSRefCountHeader *)0x0;
            local_178 = 3;
            JVar36 = (JSValue)(ZEXT816(3) << 0x40);
            JVar35 = (JSValue)(ZEXT816(3) << 0x40);
            goto LAB_00136247;
          }
          JVar25 = JVar26;
          if ((int)JVar33.tag == 6) {
            local_168 = JVar33.tag & 0xffffffff;
LAB_001368d0:
            JVar37.tag = (int64_t)local_1c0;
            JVar37.u.ptr = JVar25.ptr;
            JVar33.tag = local_158;
            JVar33.u.float64 = local_150.float64;
            local_198.float64 = 0.0;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_178;
            val_00 = (JSValue)(auVar10 << 0x40);
            JVar36 = (JSValue)(ZEXT816(3) << 0x40);
            JVar35 = (JSValue)(ZEXT816(3) << 0x40);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_168;
            JVar39 = (JSValue)(auVar5 << 0x40);
            JVar32.tag = val.tag;
            JVar32.u.ptr = local_180.ptr;
            ctx = local_170;
            local_1b8 = JVar26;
            goto LAB_00135cf4;
          }
          if (v_b.error_status != 0) goto LAB_001368d0;
          iVar13 = v_b.len;
          if (v_b.size <= v_b.len) {
            JVar25._0_4_ = v_b.len + (v_b.len >> 1) + 0x1fU & 0xffffffef;
            JVar25._4_4_ = 0;
            if (v_b.arr == v_b.def) {
              pJVar18 = (JSValueUnion *)
                        js_realloc2(v_b.ctx,(void *)0x0,(long)(int)JVar25._0_4_ << 4,
                                    (size_t *)&thisIndex);
              if (pJVar18 != (JSValueUnion *)0x0) {
                pJVar18[6] = v_b.def[3].u;
                pJVar18[7] = (JSValueUnion)v_b.def[3].tag;
                pJVar18[4] = v_b.def[2].u;
                pJVar18[5] = (JSValueUnion)v_b.def[2].tag;
                pJVar18[2] = v_b.def[1].u;
                pJVar18[3] = (JSValueUnion)v_b.def[1].tag;
                *pJVar18 = v_b.def[0].u;
                pJVar18[1] = (JSValueUnion)v_b.def[0].tag;
                goto LAB_0013603c;
              }
            }
            else {
              pJVar18 = (JSValueUnion *)
                        js_realloc2(v_b.ctx,v_b.arr,(long)(int)JVar25._0_4_ << 4,
                                    (size_t *)&thisIndex);
              if (pJVar18 != (JSValueUnion *)0x0) {
LAB_0013603c:
                JVar26._0_4_ = JVar25._0_4_ + (int)((ulong)thisIndex >> 4);
                JVar26._4_4_ = 0;
                iVar13 = v_b.len;
                v_b.arr = (JSValue *)pJVar18;
                v_b.size = JVar26._0_4_;
                goto LAB_00136062;
              }
            }
            value_buffer_free(&v_b);
            JS_FreeValue(v_b.ctx,JVar33);
            v_b.error_status = -1;
            goto LAB_001368d0;
          }
LAB_00136062:
          pJVar23 = local_170;
          v_b.arr[iVar13].u = JVar33.u;
          v_b.arr[iVar13].tag = JVar33.tag;
          v_b.len = iVar13 + 1;
          if (iVar12 == 0) goto LAB_00136203;
          v_04.tag = (int64_t)local_1c0;
          v_04.u.ptr = (void *)(uVar19 | (long)JVar30.ptr << 0x20);
          JS_FreeValue(local_170,v_04);
          JVar33 = JS_GetPropertyInt64(pJVar23,JVar33,0);
          JVar37 = JS_ToStringFree(pJVar23,JVar33);
          ctx = local_170;
          local_1b8 = JVar37.u;
          JVar30.float64 = local_1b8.float64 >> 0x20;
          if ((int)JVar37.tag == -7) {
            if ((*(uint *)((long)local_1b8.ptr + 4) & 0x7fffffff) != 0) goto LAB_0013619d;
            JVar33 = JS_GetPropertyInternal(local_170,this_val,0x55,this_val,0);
            iVar13 = JS_ToLengthFree(ctx,&thisIndex,JVar33);
            if (iVar13 < 0) goto LAB_001361f9;
            uVar19 = string_advance_index((JSString *)local_180.ptr,thisIndex,unicode);
            bVar31 = (long)(int)uVar19 == uVar19;
            JVar26.float64 = (double)(long)uVar19;
            if (bVar31) {
              JVar26.ptr = (void *)(uVar19 & 0xffffffff);
            }
            iVar21 = 7;
            if (bVar31) {
              iVar21 = 0;
            }
            val_01.tag = iVar21;
            val_01.u.float64 = JVar26.float64;
            uVar15 = JS_SetProperty(ctx,this_val,0x55,val_01);
            if (-1 < (int)uVar15) goto LAB_0013619d;
            uVar15 = uVar15 >> 0x1e & 0xfffffffe;
          }
          else {
            if ((int)JVar37.tag == 6) {
              local_168 = JVar37.tag & 0xffffffff;
              break;
            }
LAB_0013619d:
            uVar15 = 0;
          }
        } while (uVar15 == 0);
        JVar33.tag = local_158;
        JVar33.u.float64 = local_150.float64;
        JVar32.tag = val.tag;
        JVar32.u.ptr = local_180.ptr;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_168;
        JVar39 = (JSValue)(auVar6 << 0x40);
        local_198.float64 = 0.0;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_178;
        val_00 = (JSValue)(auVar11 << 0x40);
        JVar36 = (JSValue)(ZEXT816(3) << 0x40);
        JVar35 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_00135cf4;
      }
      JVar33 = JS_GetPropertyInternal(ctx,this_val,0x3c,this_val,0);
      if ((int)JVar33.tag != 6) {
        BVar14 = js_same_value(ctx,JVar33,ctx->regexp_ctor);
        JS_FreeValue(ctx,JVar33);
        if (BVar14 == 0) goto LAB_00135f1f;
        pJVar23 = ctx;
        JVar33 = JS_GetPropertyInternal(ctx,this_val,0x86,this_val,0);
        if ((int)JVar33.tag != 6) {
          BVar14 = JS_IsCFunction(pJVar23,JVar33,js_regexp_exec,0);
          JS_FreeValue(ctx,JVar33);
          if (BVar14 == 0) goto LAB_00135f1f;
        }
      }
      pJVar17 = js_get_regexp(ctx,this_val,1);
      local_168 = 6;
      if (pJVar17 == (JSRegExp *)0x0) {
        JVar39 = (JSValue)(ZEXT816(6) << 0x40);
        JVar30.float64 = 0.0;
      }
      else {
        string_buffer_init(ctx,(StringBuffer *)&thisIndex,0);
        val.u.ptr = local_180.ptr;
        JVar33 = JS_ToString(ctx,val);
        JVar30 = JVar33.u;
        if ((int)JVar33.tag == 6) {
          capture = (uint8_t **)0x0;
        }
        else {
          bc_buf = pJVar17->bytecode + 1;
          uVar15 = lre_get_flags((uint8_t *)bc_buf);
          if ((uVar15 & 0x21) == 0) {
            position = 0;
LAB_00136929:
            uVar16 = lre_get_capture_count((uint8_t *)bc_buf);
            JVar26.float64 = 0.0;
            if ((int)uVar16 < 1) {
              capture = (uint8_t **)0x0;
            }
            else {
              capture = (uint8_t **)js_malloc(ctx,(ulong)uVar16 << 4);
              if (capture == (uint8_t **)0x0) goto LAB_00136950;
            }
            uVar19 = *(ulong *)((long)JVar30.ptr + 4);
            uVar28 = uVar19 >> 0x1f & 1;
            cbuf = (JSString *)((long)JVar30.ptr + 0x10);
            iVar21 = position;
            while (iVar21 <= (long)(ulong)((uint)uVar19 & 0x7fffffff)) {
              iVar12 = lre_exec(capture,(uint8_t *)bc_buf,(uint8_t *)cbuf,(int)iVar21,
                                (uint)uVar19 & 0x7fffffff,(int)uVar28,ctx);
              if (iVar12 != 1) {
                if (iVar12 < 0) {
                  JS_ThrowInternalError(ctx,"out of memory in regexp execution");
                  goto LAB_00136bd9;
                }
                if (((uVar15 & 0x21) != 0) || (iVar12 == 2)) {
                  iVar12 = JS_SetProperty(ctx,this_val,0x55,(JSValue)ZEXT816(0));
joined_r0x00136ba1:
                  if (iVar12 < 0) goto LAB_00136bd9;
                }
                break;
              }
              sVar20 = (sbyte)uVar28;
              uVar29 = (long)capture[1] - (long)cbuf >> sVar20;
              uVar22 = (uint32_t)uVar29;
              to = (uint32_t)((long)*capture - (long)cbuf >> sVar20);
              nCaptures = uVar22;
              if ((JVar26.int32 < (int)to) &&
                 (iVar12 = string_buffer_concat
                                     ((StringBuffer *)&thisIndex,(JSString *)JVar30.ptr,JVar26.int32
                                      ,to), iVar12 != 0)) goto LAB_00136bd9;
              if ((uVar15 & 1) == 0) {
                val_04.u = uVar29 & 0xffffffff;
                val_04.tag = 0;
                iVar12 = JS_SetProperty(ctx,this_val,0x55,val_04);
                JVar26.ptr = (void *)(uVar29 & 0xffffffff);
                goto joined_r0x00136ba1;
              }
              if (uVar22 == to) {
                if ((((uVar15 & 0x10) == 0) || (-1 < (int)*(uint *)((long)JVar30.ptr + 4))) ||
                   ((*(uint *)((long)JVar30.ptr + 4) & 0x7fffffff) <= to)) {
                  nCaptures = to + 1;
                  uVar22 = nCaptures;
                }
                else {
                  string_getc((JSString *)JVar30.ptr,(int *)&nCaptures);
                  uVar22 = nCaptures;
                }
              }
              uVar19 = *(ulong *)((long)JVar30.ptr + 4);
              JVar26.ptr = (void *)(uVar29 & 0xffffffff);
              iVar21 = (int64_t)(int)uVar22;
            }
            iVar12 = string_buffer_concat
                               ((StringBuffer *)&thisIndex,(JSString *)JVar30.ptr,JVar26.int32,
                                *(uint *)((long)JVar30.ptr + 4) & 0x7fffffff);
            if (iVar12 == 0) {
              JS_FreeValue(ctx,JVar33);
              (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,capture);
              JVar39 = string_buffer_end((StringBuffer *)&thisIndex);
              JVar30.float64 = JVar39.u.float64 & 0xffffffff00000000;
              goto LAB_00136c19;
            }
          }
          else {
            JVar37 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
            if (((int)JVar37.tag != 6) &&
               (iVar12 = JS_ToLengthFree(ctx,&position,JVar37), iVar12 == 0)) goto LAB_00136929;
LAB_00136950:
            capture = (uint8_t **)0x0;
          }
        }
LAB_00136bd9:
        JS_FreeValue(ctx,JVar33);
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,capture);
        (**(code **)(*(long *)(thisIndex + 0x18) + 8))(*(long *)(thisIndex + 0x18) + 0x20,local_120)
        ;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_168;
        JVar39 = (JSValue)(auVar1 << 0x40);
        JVar30.float64 = 0.0;
      }
LAB_00136c19:
      JVar33.tag = local_158;
      JVar33.u.float64 = local_150.float64;
      local_198 = JVar30;
    }
    local_1b8.float64 = 0.0;
    JVar32.tag = val.tag;
    JVar32.u.float64 = local_180.float64;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_178;
    val_00 = (JSValue)(auVar8 << 0x40);
    JVar36 = (JSValue)(ZEXT816(3) << 0x40);
    JVar35 = (JSValue)(ZEXT816(3) << 0x40);
    JVar37.tag = 3;
    JVar37.u.ptr = JVar26.ptr;
  }
LAB_00135cf4:
  local_178 = val_00.tag;
  p_1 = (JSRefCountHeader *)val_00.u;
  local_168 = JVar39.tag;
  local_158 = JVar33.tag;
  local_150 = JVar33.u;
  val.tag = JVar32.tag;
  local_180 = JVar32.u;
  (*((local_b0.ctx)->rt->mf).js_free)(&(local_b0.ctx)->rt->malloc_state,local_b0.str);
  JVar38.tag = local_168;
  JVar38.u.float64 = JVar39.u.float64;
  goto LAB_00135d0f;
LAB_00136247:
  local_1d0 = JVar35.tag;
  local_1a8 = JVar35.u;
  local_1c0 = (JSString *)JVar39.tag;
  local_1b8 = JVar39.u;
  JVar37.tag = (int64_t)local_1c0;
  JVar37.u.ptr = JVar26.ptr;
  if (v_b.len <= lVar24) goto LAB_00136aad;
  JVar30 = (JSValueUnion)v_b.arr[lVar24].u.ptr;
  iVar21 = v_b.arr[lVar24].tag;
  obj_03.tag = iVar21;
  obj_03.u.ptr = JVar30.ptr;
  local_138 = uVar22;
  local_130 = lVar24;
  iVar12 = js_get_length32(ctx,&nCaptures,obj_03);
  val_00.tag = local_178;
  val_00.u.ptr = p_1;
  if (iVar12 < 0) {
LAB_00136c6e:
    local_1c0 = (JSString *)JVar39.tag;
    local_1b8 = JVar39.u;
    JVar37.tag = (int64_t)local_1c0;
    JVar37.u.ptr = JVar26.ptr;
    JVar33.tag = local_158;
    JVar33.u.float64 = local_150.float64;
    JVar32.tag = val.tag;
    JVar32.u.ptr = local_180.ptr;
    JVar30.float64 = local_1b8.float64 >> 0x20;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_168;
    JVar39 = (JSValue)(auVar7 << 0x40);
    local_198.float64 = 0.0;
    goto LAB_00135cf4;
  }
  JS_FreeValue(ctx,JVar39);
  obj.tag = iVar21;
  obj.u.ptr = JVar30.ptr;
  JVar33 = JS_GetPropertyInt64(ctx,obj,0);
  JVar39 = JS_ToStringFree(ctx,JVar33);
  val_00.tag = local_178;
  local_1b8 = JVar39.u;
  if ((uint)JVar39.tag == 6) goto LAB_00136c6e;
  obj_00.tag = iVar21;
  obj_00.u.ptr = JVar30.ptr;
  this_obj.tag = iVar21;
  this_obj.u.ptr = JVar30.ptr;
  JVar33 = JS_GetPropertyInternal(ctx,obj_00,0x57,this_obj,0);
  iVar12 = JS_ToLengthFree(ctx,&position,JVar33);
  val_00.tag = local_178;
  if (iVar12 != 0) goto LAB_00136c6e;
  uVar19 = (ulong)((uint)*(undefined8 *)((long)local_180.ptr + 4) & 0x7fffffff);
  if ((position <= (long)uVar19) && (uVar19 = position, position < 0)) {
    position = 0;
    uVar19 = position;
  }
  position = uVar19;
  JVar35.u.ptr = (void *)((ulong)local_1a8.ptr & 0xffffffff | (long)JVar26.ptr << 0x20);
  JVar35.tag = local_1d0;
  local_148 = position;
  JS_FreeValue(ctx,JVar35);
  JVar35 = JS_NewArray(ctx);
  val_00.tag = local_178;
  JVar26.float64 = JVar35.u.float64 >> 0x20;
  if ((int)JVar35.tag == 6) goto LAB_00136c6e;
  if (0xfffffff4 < (uint)JVar39.tag) {
    *(int *)local_1b8.ptr = *local_1b8.ptr + 1;
  }
  iVar12 = JS_DefinePropertyValueInt64(ctx,JVar35,0,JVar39,0x4007);
  val_00.tag = local_178;
  if (iVar12 < 0) goto LAB_00136c6e;
  uVar28 = (ulong)nCaptures;
  uVar19 = 3;
  local_140.ptr = JVar26.ptr;
  while( true ) {
    local_1d0 = JVar35.tag;
    local_1c0 = (JSString *)JVar39.tag;
    local_190 = JVar36.u;
    uVar29 = uVar19 - 2;
    if (uVar28 <= uVar29) break;
    obj_01.tag = iVar21;
    obj_01.u.ptr = JVar30.ptr;
    JVar33 = JS_GetPropertyInt64(ctx,obj_01,uVar29);
    if ((int)JVar33.tag != 3) {
      if ((int)JVar33.tag != 6) {
        JVar33 = JS_ToStringFree(ctx,JVar33);
        if ((int)JVar33.tag != 6) goto LAB_00136421;
      }
LAB_0013677d:
      val_00.tag = local_178;
      JVar37.tag = (int64_t)local_1c0;
      JVar37.u.ptr = local_140.ptr;
      JVar33.tag = local_158;
      JVar33.u.ptr = local_150.ptr;
      JVar30.float64 = local_1b8.float64 >> 0x20;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_168;
      JVar39 = (JSValue)(auVar4 << 0x40);
      local_198.float64 = 0.0;
      JVar32.tag = val.tag;
      JVar32.u.ptr = local_180.ptr;
      goto LAB_00135cf4;
    }
LAB_00136421:
    iVar12 = JS_DefinePropertyValueInt64(ctx,JVar35,uVar29,JVar33,0x4007);
    if (iVar12 < 0) goto LAB_0013677d;
    uVar19 = uVar19 + 1;
  }
  v_05.tag = local_178;
  v_05.u.ptr = p_1;
  JS_FreeValue(ctx,v_05);
  obj_02.tag = iVar21;
  obj_02.u.ptr = JVar30.ptr;
  this_obj_00.tag = iVar21;
  this_obj_00.u.ptr = JVar30.ptr;
  val_00 = JS_GetPropertyInternal(ctx,obj_02,0x87,this_obj_00,0);
  JVar26 = local_140;
  local_178 = val_00.tag;
  p_1 = (JSRefCountHeader *)val_00.u;
  iVar12 = (int)val_00.tag;
  if (iVar12 == 6) goto LAB_00136c6e;
  if (local_134 != 0) {
    iVar13 = JS_DefinePropertyValueInt64(ctx,JVar35,uVar29,(JSValue)ZEXT416((uint)local_148),0x4007)
    ;
    JVar26 = local_140;
    val_00.tag = local_178;
    val_00.u.ptr = p_1;
    if (-1 < iVar13) {
      if (0xfffffff4 < (uint)JVar32.tag) {
        *(int *)local_180.ptr = *local_180.ptr + 1;
      }
      uVar15 = (uint)uVar19 - 1;
      val_02.tag = val.tag;
      val_02.u.ptr = local_180.ptr;
      iVar13 = JS_DefinePropertyValueInt64(ctx,JVar35,(ulong)uVar15,val_02,0x4007);
      val_00.tag = local_178;
      if (-1 < iVar13) {
        if (iVar12 != 3) {
          if (0xfffffff4 < (uint)local_178) {
            *p_1 = (JSRefCountHeader)(*(int *)p_1 + 1);
          }
          val_03.tag = local_178;
          val_03.u.ptr = p_1;
          uVar15 = (uint)uVar19;
          iVar12 = JS_DefinePropertyValueInt64(ctx,JVar35,uVar19 & 0xffffffff,val_03,0x4007);
          val_00.tag = local_178;
          if (iVar12 < 0) goto LAB_00136c6e;
        }
        thisIndex = thisIndex & 0xffffffff00000000;
        local_120 = (JSString *)0x3;
        _local_118 = JVar35;
        JS_FreeValue(ctx,JVar36);
        this_val_00.tag = (int64_t)local_c0.ptr;
        this_val_00.u.float64 = local_b8.float64;
        JVar33 = js_function_apply(ctx,this_val_00,uVar15,(JSValue *)&thisIndex,0);
        JVar36 = JS_ToStringFree(ctx,JVar33);
        goto LAB_0013670e;
      }
    }
    goto LAB_00136c6e;
  }
  if (iVar12 == 3) {
    uVar19 = 0;
    JVar33 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    JVar33 = JS_ToObject(ctx,val_00);
    val_00.tag = local_178;
    val_00.u.ptr = p_1;
    if ((int)JVar33.tag == 6) goto LAB_00136c6e;
    uVar19 = (ulong)JVar33.u.ptr & 0xffffffff00000000;
  }
  local_120 = local_1c0;
  local_118.float64 = local_180.float64;
  local_108 = local_148 & 0xffffffff;
  local_100 = 0;
  local_f0 = local_1d0;
  JVar30.ptr = (void *)((ulong)JVar33.u.ptr & 0xffffffff | uVar19);
  local_d8.float64 = local_150.float64;
  local_d0 = local_158;
  thisIndex = (int64_t)local_1b8;
  local_110 = val.tag;
  local_f8 = JVar35.u;
  local_e8.ptr = JVar30.ptr;
  local_e0 = JVar33.tag;
  JS_FreeValue(ctx,JVar36);
  this_val_01.tag = extraout_RDX;
  this_val_01.u.ptr = &thisIndex;
  JVar36 = js_string___GetSubstitution(ctx,this_val_01,(int)uVar19,(JSValue *)local_190.ptr);
  v_06.tag = JVar33.tag;
  v_06.u.ptr = JVar30.ptr;
  JS_FreeValue(ctx,v_06);
LAB_0013670e:
  val_00.tag = local_178;
  val_00.u.ptr = p_1;
  if ((int)JVar36.tag == 6) goto LAB_00136c6e;
  uVar22 = local_138;
  if ((long)(int)local_138 <= (long)local_148) {
    uVar22 = (uint32_t)local_148;
    string_buffer_concat(&local_b0,(JSString *)local_180.ptr,local_138,uVar22);
    string_buffer_concat_value(&local_b0,JVar36);
    uVar22 = (*(uint *)((long)local_1b8.ptr + 4) & 0x7fffffff) + uVar22;
  }
  lVar24 = local_130 + 1;
  goto LAB_00136247;
LAB_00136aad:
  JVar30.float64 = local_1b8.float64 >> 0x20;
  string_buffer_concat
            (&local_b0,(JSString *)local_180.ptr,uVar22,
             *(uint *)((long)local_180.ptr + 4) & 0x7fffffff);
  JVar38 = string_buffer_end(&local_b0);
  local_198.float64 = JVar38.u.float64 & 0xffffffff00000000;
LAB_00135d0f:
  local_1d0 = JVar35.tag;
  local_1a8 = JVar35.u;
  local_1c0 = (JSString *)JVar37.tag;
  local_168 = JVar38.tag;
  value_buffer_free(&v_b);
  v.tag = local_158;
  v.u.float64 = local_150.float64;
  JS_FreeValue(ctx,v);
  v_00.u.ptr = (void *)((ulong)local_1b8.ptr & 0xffffffff | (long)JVar30.ptr << 0x20);
  v_00.tag = (int64_t)local_1c0;
  JS_FreeValue(ctx,v_00);
  v_01.u.ptr = (void *)((ulong)local_1a8.ptr & 0xffffffff | (long)JVar37.u.ptr << 0x20);
  v_01.tag = local_1d0;
  JS_FreeValue(ctx,v_01);
  JS_FreeValue(ctx,JVar36);
  v_02.tag = local_178;
  v_02.u.ptr = p_1;
  JS_FreeValue(ctx,v_02);
  v_03.tag = val.tag;
  v_03.u.float64 = local_180.float64;
  JS_FreeValue(ctx,v_03);
  local_198.float64 = (ulong)JVar38.u.ptr & 0xffffffff | local_198.float64;
  uVar19 = local_168;
LAB_00135da5:
  JVar34.tag = uVar19;
  JVar34.u.ptr = local_198.ptr;
  return JVar34;
}

Assistant:

static JSValue js_regexp_Symbol_replace(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    // [Symbol.replace](str, rep)
    JSValueConst rx = this_val, rep = argv[1];
    JSValueConst args[6];
    JSValue str, rep_val, matched, tab, rep_str, namedCaptures, res;
    JSString *sp, *rp;
    StringBuffer b_s, *b = &b_s;
    ValueBuffer v_b, *results = &v_b;
    int nextSourcePosition, n, j, functionalReplace, is_global, fullUnicode;
    uint32_t nCaptures;
    int64_t position;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    string_buffer_init(ctx, b, 0);
    value_buffer_init(ctx, results);

    rep_val = JS_UNDEFINED;
    matched = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    rep_str = JS_UNDEFINED;
    namedCaptures = JS_UNDEFINED;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
        
    sp = JS_VALUE_GET_STRING(str);
    rp = NULL;
    functionalReplace = JS_IsFunction(ctx, rep);
    if (!functionalReplace) {
        rep_val = JS_ToString(ctx, rep);
        if (JS_IsException(rep_val))
            goto exception;
        rp = JS_VALUE_GET_STRING(rep_val);
    }
    fullUnicode = 0;
    is_global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (is_global < 0)
        goto exception;
    if (is_global) {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
    }

    if (rp && rp->len == 0 && is_global && js_is_standard_regexp(ctx, rx)) {
        /* use faster version for simple cases */
        res = JS_RegExpDelete(ctx, rx, str);
        goto done;
    }
    for(;;) {
        JSValue result;
        result = JS_RegExpExec(ctx, rx, str);
        if (JS_IsException(result))
            goto exception;
        if (JS_IsNull(result))
            break;
        if (value_buffer_append(results, result) < 0)
            goto exception;
        if (!is_global)
            break;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_IsEmptyString(matched)) {
            /* always advance of at least one char */
            int64_t thisIndex, nextIndex;
            if (JS_ToLengthFree(ctx, &thisIndex, JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                goto exception;
            nextIndex = string_advance_index(sp, thisIndex, fullUnicode);
            if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                goto exception;
        }
    }
    nextSourcePosition = 0;
    for(j = 0; j < results->len; j++) {
        JSValueConst result;
        result = results->arr[j];
        if (js_get_length32(ctx, &nCaptures, result) < 0)
            goto exception;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_ToLengthFree(ctx, &position, JS_GetProperty(ctx, result, JS_ATOM_index)))
            goto exception;
        if (position > sp->len)
            position = sp->len;
        else if (position < 0)
            position = 0;
        /* ignore substition if going backward (can happen
           with custom regexp object) */
        JS_FreeValue(ctx, tab);
        tab = JS_NewArray(ctx);
        if (JS_IsException(tab))
            goto exception;
        if (JS_DefinePropertyValueInt64(ctx, tab, 0, JS_DupValue(ctx, matched),
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            goto exception;
        for(n = 1; n < nCaptures; n++) {
            JSValue capN;
            capN = JS_GetPropertyInt64(ctx, result, n);
            if (JS_IsException(capN))
                goto exception;
            if (!JS_IsUndefined(capN)) {
                capN = JS_ToStringFree(ctx, capN);
                if (JS_IsException(capN))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, tab, n, capN,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
        JS_FreeValue(ctx, namedCaptures);
        namedCaptures = JS_GetProperty(ctx, result, JS_ATOM_groups);
        if (JS_IsException(namedCaptures))
            goto exception;
        if (functionalReplace) {
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_NewInt32(ctx, position), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, str), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (!JS_IsUndefined(namedCaptures)) {
                if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, namedCaptures), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
            }
            args[0] = JS_UNDEFINED;
            args[1] = tab;
            JS_FreeValue(ctx, rep_str);
            rep_str = JS_ToStringFree(ctx, js_function_apply(ctx, rep, 2, args, 0));
        } else {
            JSValue namedCaptures1;
            if (!JS_IsUndefined(namedCaptures)) {
                namedCaptures1 = JS_ToObject(ctx, namedCaptures);
                if (JS_IsException(namedCaptures1))
                    goto exception;
            } else {
                namedCaptures1 = JS_UNDEFINED;
            }
            args[0] = matched;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, position);
            args[3] = tab;
            args[4] = namedCaptures1;
            args[5] = rep_val;
            JS_FreeValue(ctx, rep_str);
            rep_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
            JS_FreeValue(ctx, namedCaptures1);
        }
        if (JS_IsException(rep_str))
            goto exception;
        if (position >= nextSourcePosition) {
            string_buffer_concat(b, sp, nextSourcePosition, position);
            string_buffer_concat_value(b, rep_str);
            nextSourcePosition = position + JS_VALUE_GET_STRING(matched)->len;
        }
    }
    string_buffer_concat(b, sp, nextSourcePosition, sp->len);
    res = string_buffer_end(b);
    goto done1;

exception:
    res = JS_EXCEPTION;
done:
    string_buffer_free(b);
done1:
    value_buffer_free(results);
    JS_FreeValue(ctx, rep_val);
    JS_FreeValue(ctx, matched);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, rep_str);
    JS_FreeValue(ctx, namedCaptures);
    JS_FreeValue(ctx, str);
    return res;
}